

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalSequenceSideEffCase2(ShaderEvalContext *ctx)

{
  undefined8 uVar1;
  Vec2 local_40;
  Functional local_38 [8];
  Vector<float,_2> local_30;
  VecAccess<float,_4,_2> local_28;
  
  uVar1 = *(undefined8 *)(ctx->in[2].m_data + 1);
  local_40.m_data[1] = (float)uVar1;
  local_40.m_data[0] = (float)((ulong)uVar1 >> 0x20);
  sequenceSideEffCase2(local_38,0.0 < ctx->in[0].m_data[2],0.0 < ctx->in[1].m_data[0],&local_40);
  tcu::Vector<int,_2>::cast<float>((Vector<int,_2> *)local_38);
  local_28.m_vector = &ctx->color;
  local_28.m_index[0] = 1;
  local_28.m_index[1] = 2;
  tcu::VecAccess<float,_4,_2>::operator=(&local_28,&local_30);
  return;
}

Assistant:

void evalSequenceSideEffCase2	(ShaderEvalContext& ctx) { ctx.color.yz()	= sequenceSideEffCase2(ctx.in[0].z() > 0.0f, ctx.in[1].x() > 0.0f, ctx.in[2].swizzle(2, 1)).asFloat(); }